

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_log.cpp
# Opt level: O0

void __thiscall cubeb_log_message::cubeb_log_message(cubeb_log_message *this,char *str)

{
  size_t sVar1;
  char *in_RSI;
  char *in_RDI;
  size_t length;
  char *in_stack_ffffffffffffffd8;
  
  sVar1 = strlen(in_RSI);
  if (sVar1 < 0x100) {
    PodCopy<char>(in_RDI,in_stack_ffffffffffffffd8,0x10bde8);
    in_RDI[sVar1] = '\0';
  }
  return;
}

Assistant:

cubeb_log_message(char const str[CUBEB_LOG_MESSAGE_MAX_SIZE])
  {
    size_t length = strlen(str);
    /* paranoia against malformed message */
    assert(length < CUBEB_LOG_MESSAGE_MAX_SIZE);
    if (length > CUBEB_LOG_MESSAGE_MAX_SIZE - 1) {
      return;
    }
    PodCopy(storage, str, length);
    storage[length] = '\0';
  }